

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  _Rb_tree_node_base *str;
  int __errnum;
  int iVar1;
  uint uVar2;
  int *piVar3;
  ssize_t sVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  char *pcVar7;
  uint uVar8;
  int error;
  void *__buf;
  undefined1 in_R9B;
  ulong uVar9;
  StringPiece full;
  string filename;
  StringPiece local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  
  if (this->had_error_ == false) {
    if ((prefix->_M_string_length == 0) ||
       (iVar1 = access((prefix->_M_dataplus)._M_p,0), iVar1 != -1)) {
      p_Var5 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var5 == &(this->files_)._M_t._M_impl.super__Rb_tree_header) {
          return true;
        }
        str = p_Var5 + 1;
        __buf = *(void **)(p_Var5 + 2);
        uVar8 = *(uint *)&p_Var5[2]._M_parent;
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  (&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
        full.length_ = (size_type)"/\\";
        full.ptr_ = (char *)local_58.length_;
        Split_abi_cxx11_(&parts,(protobuf *)local_58.ptr_,full,(char *)0x1,(bool)in_R9B);
        std::__cxx11::string::string((string *)&filename,(string *)prefix);
        for (uVar9 = 0;
            uVar9 < ((long)parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U; uVar9 = uVar9 + 1)
        {
          std::__cxx11::string::append((string *)&filename);
          iVar1 = mkdir(filename._M_dataplus._M_p,0x1ff);
          if ((iVar1 != 0) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)str);
            poVar6 = std::operator<<(poVar6,": while trying to create directory ");
            poVar6 = std::operator<<(poVar6,(string *)&filename);
            poVar6 = std::operator<<(poVar6,": ");
            pcVar7 = strerror(*piVar3);
            poVar6 = std::operator<<(poVar6,pcVar7);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__cxx11::string::~string((string *)&filename);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&parts);
            return false;
          }
          std::__cxx11::string::push_back((char)&filename);
        }
        std::__cxx11::string::~string((string *)&filename);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
        std::operator+(&filename,prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
        while (iVar1 = open(filename._M_dataplus._M_p,0x241,0x1b6), iVar1 < 0) {
          piVar3 = __errno_location();
          iVar1 = *piVar3;
          if (iVar1 != 4) {
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
            poVar6 = std::operator<<(poVar6,": ");
            pcVar7 = strerror(iVar1);
            std::operator<<(poVar6,pcVar7);
            goto LAB_0027c162;
          }
        }
        for (; 0 < (int)uVar8; uVar8 = uVar8 - uVar2) {
          while( true ) {
            sVar4 = write(iVar1,__buf,(ulong)uVar8);
            uVar2 = (uint)sVar4;
            if (-1 < (int)uVar2) break;
            piVar3 = __errno_location();
            __errnum = *piVar3;
            if (__errnum != 4) {
              poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
              poVar6 = std::operator<<(poVar6,": write: ");
              pcVar7 = strerror(__errnum);
              std::operator<<(poVar6,pcVar7);
              goto LAB_0027c162;
            }
          }
          if (uVar2 == 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
            poVar6 = std::operator<<(poVar6,": write() returned zero?");
            std::endl<char,std::char_traits<char>>(poVar6);
            goto LAB_0027c162;
          }
          __buf = (void *)((long)__buf + (ulong)(uVar2 & 0x7fffffff));
        }
        iVar1 = close(iVar1);
        if (iVar1 != 0) break;
        std::__cxx11::string::~string((string *)&filename);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      }
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
      poVar6 = std::operator<<(poVar6,": close: ");
      pcVar7 = strerror(iVar1);
      std::operator<<(poVar6,pcVar7);
LAB_0027c162:
      std::__cxx11::string::~string((string *)&filename);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)prefix);
      poVar6 = std::operator<<(poVar6,": ");
      piVar3 = __errno_location();
      pcVar7 = strerror(*piVar3);
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  return false;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const std::string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (const auto& pair : files_) {
    const std::string& relative_filename = pair.first;
    const char* data = pair.second.data();
    int size = pair.second.size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    std::string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
          open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}